

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O0

void __thiscall
soul::heart::Printer::PrinterStream::printVarWithPrefix(PrinterStream *this,string *name)

{
  byte bVar1;
  char *pcVar2;
  CodePrinter *this_00;
  string local_58;
  string local_38;
  string *local_18;
  string *name_local;
  PrinterStream *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  bVar1 = std::__cxx11::string::empty();
  checkAssertion((bool)((bVar1 ^ 0xff) & 1),"! name.empty()","printVarWithPrefix",0x200);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
  if (*pcVar2 == '$') {
    choc::text::CodePrinter::operator<<(this->out,local_18);
  }
  else {
    this_00 = choc::text::CodePrinter::operator<<(this->out,"$");
    std::__cxx11::string::string((string *)&local_58,(string *)local_18);
    removeCharacter(&local_38,&local_58,'$');
    choc::text::CodePrinter::operator<<(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void printVarWithPrefix (const std::string& name)
        {
            SOUL_ASSERT (! name.empty());

            if (name[0] == '$')
                out << name;
            else
                out << "$" << removeCharacter (name, '$');
        }